

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlcrc.c
# Opt level: O2

err_t RenderData(ebml_master *Element,stream *Output,bool_t bForceWithoutMandatory,
                bool_t bWithDefault,int ForProfile,filepos_t *Rendered)

{
  code *pcVar1;
  bool_t bVar2;
  bool_t bVar3;
  ebml_context *Context;
  ebml_crc *peVar4;
  err_t eVar5;
  filepos_t fVar6;
  stream *Output_00;
  long lVar7;
  size_t *Rendered_00;
  array local_78;
  ebml_crc *local_68;
  int local_5c;
  uint8_t *Data;
  filepos_t CrcSize;
  long local_48;
  size_t Written;
  filepos_t _Rendered;
  
  Rendered_00 = (size_t *)&_Rendered;
  if (Rendered != (filepos_t *)0x0) {
    Rendered_00 = (size_t *)Rendered;
  }
  *Rendered_00 = 0;
  if ((bForceWithoutMandatory == 0) &&
     (bVar2 = CheckMandatory(Element,bWithDefault,ForProfile), bVar2 == 0)) {
    __assert_fail("CheckMandatory((ebml_master*)Element, bWithDefault, ForProfile)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                  ,0x1d9,
                  "err_t RenderData(ebml_master *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                 );
  }
  if (Element->CheckSumStatus == 0) {
    eVar5 = InternalRender(Element,Output,bForceWithoutMandatory,bWithDefault,ForProfile,
                           (filepos_t *)Rendered_00);
    return eVar5;
  }
  bVar2 = Node_IsPartOf(Output,0x534d454d);
  local_78._Begin = (char *)0x0;
  local_78._Used = 0;
  eVar5 = -2;
  if ((bVar2 != 0) || (bVar3 = ArrayResize(&local_78,(Element->Base).DataSize - 6,0), bVar3 != 0)) {
    Context = EBML_getContextEbmlCrc32();
    peVar4 = (ebml_crc *)EBML_ElementCreate(Element,Context,0,ForProfile);
    if (peVar4 != (ebml_crc *)0x0) {
      local_68 = peVar4;
      if (bVar2 == 0) {
        Output_00 = (stream *)NodeCreate(Element,0x534d454d);
        if (Output_00 == (stream *)0x0) {
          eVar5 = -2;
        }
        else {
          if (Output == (stream *)0x0) {
            __assert_fail("(const void*)(Output)!=NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                          ,0x1fb,
                          "err_t RenderData(ebml_master *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                         );
          }
          lVar7 = (**(code **)((long)(Output->Base).VMT + 0x78))(Output,0,1);
          CrcSize = lVar7 + 6;
          (**(code **)((long)(Output_00->Base).VMT + 0x20))
                    (Output_00,0x100,local_78._Begin,local_78._Used);
          (**(code **)((long)(Output_00->Base).VMT + 0x20))(Output_00,0x102,&CrcSize,8);
          eVar5 = InternalRender(Element,Output_00,bForceWithoutMandatory,bWithDefault,ForProfile,
                                 (filepos_t *)Rendered_00);
          peVar4 = local_68;
          if (eVar5 == 0) {
            if (*Rendered_00 != local_78._Used) {
              __assert_fail("Err!=ERR_NONE || *Rendered == (filepos_t)ARRAYCOUNT(TmpBuf,uint8_t)",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                            ,0x1ff,
                            "err_t RenderData(ebml_master *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                           );
            }
            EBML_CRCAddBuffer(local_68,local_78._Begin,*Rendered_00);
            EBML_CRCFinalize(peVar4);
            eVar5 = EBML_ElementRender(&peVar4->Base,Output,bWithDefault,0,bForceWithoutMandatory,
                                       ForProfile,(filepos_t *)&Data);
            if (eVar5 == 0) {
              eVar5 = (**(code **)((long)(Output->Base).VMT + 0x70))
                                (Output,local_78._Begin,local_78._Used,&Written);
              if ((eVar5 == 0) && (Written != *Rendered_00)) {
                __assert_fail("Err!=ERR_NONE || (filepos_t)Written == *Rendered",
                              "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                              ,0x20a,
                              "err_t RenderData(ebml_master *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                             );
              }
              *Rendered_00 = (size_t)(Data + Written);
            }
          }
          StreamClose(Output_00);
        }
      }
      else {
        if (Output == (stream *)0x0) {
          __assert_fail("(const void*)(Output)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                        ,0x213,
                        "err_t RenderData(ebml_master *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                       );
        }
        local_48 = (**(code **)((long)(Output->Base).VMT + 0x78))(Output,6,1);
        eVar5 = InternalRender(Element,Output,bForceWithoutMandatory,bWithDefault,ForProfile,
                               (filepos_t *)Rendered_00);
        if (eVar5 == 0) {
          local_5c = ForProfile;
          (**(code **)((long)(Output->Base).VMT + 0x18))(Output,0x102,&CrcSize,8);
          (**(code **)((long)(Output->Base).VMT + 0x18))(Output,0x101,&Data);
          peVar4 = local_68;
          EBML_CRCAddBuffer(local_68,Data + (local_48 - CrcSize),(Element->Base).DataSize - 6);
          EBML_CRCFinalize(peVar4);
          pcVar1 = *(code **)((long)(Output->Base).VMT + 0x78);
          fVar6 = EBML_ElementPositionData(&Element->Base);
          (*pcVar1)(Output,fVar6,0);
          eVar5 = EBML_ElementRender(&peVar4->Base,Output,bWithDefault,0,bForceWithoutMandatory,
                                     local_5c,&CrcSize);
          *Rendered_00 = *Rendered_00 + CrcSize;
          pcVar1 = *(code **)((long)(Output->Base).VMT + 0x78);
          fVar6 = EBML_ElementPositionEnd(&Element->Base);
          (*pcVar1)(Output,fVar6,0);
        }
      }
      NodeDelete((node *)local_68);
    }
  }
  ArrayClear(&local_78);
  return eVar5;
}

Assistant:

static err_t RenderData(ebml_crc *Element, struct stream *Output, bool_t UNUSED_PARAM(bForceWithoutMandatory), bool_t UNUSED_PARAM(bWithDefault), int UNUSED_PARAM(ForProfile), filepos_t *Rendered)
{
    err_t Result;
    size_t Written = 0;
    uint8_t Buf[4];
    STORE32LE(Buf,Element->CRC);
    Result = Stream_Write(Output, Buf, 4, &Written);
    if (Rendered)
        *Rendered = Written;
    return Result;
}